

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_3_channels_with_8_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *local_3a8;
  float *local_390;
  stbir__contributors *local_388;
  float fStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1d0;
  float local_1c8;
  float fStack_1c4;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  __m128 cs;
  __m128 c;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  
  local_3a8 = output_buffer;
  local_390 = horizontal_coefficients;
  local_388 = horizontal_contributors;
  do {
    pfVar1 = decode_buffer + local_388->n0 * 3;
    local_1c8 = (float)*(undefined8 *)local_390;
    fStack_1c4 = (float)((ulong)*(undefined8 *)local_390 >> 0x20);
    local_118 = (float)*(undefined8 *)pfVar1;
    fStack_114 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_110 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_10c = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    fStack_1d0 = (float)*(undefined8 *)(local_390 + 2);
    local_138 = (float)*(undefined8 *)(pfVar1 + 4);
    fStack_134 = (float)((ulong)*(undefined8 *)(pfVar1 + 4) >> 0x20);
    fStack_130 = (float)*(undefined8 *)(pfVar1 + 6);
    fStack_12c = (float)((ulong)*(undefined8 *)(pfVar1 + 6) >> 0x20);
    fVar7 = (float)((ulong)*(undefined8 *)(local_390 + 2) >> 0x20);
    local_158 = (float)*(undefined8 *)(pfVar1 + 8);
    fStack_154 = (float)((ulong)*(undefined8 *)(pfVar1 + 8) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_14c = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    local_1f8 = (float)*(undefined8 *)(local_390 + 4);
    fStack_1f4 = (float)((ulong)*(undefined8 *)(local_390 + 4) >> 0x20);
    local_178 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_174 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    fStack_170 = (float)*(undefined8 *)(pfVar1 + 0xe);
    fStack_16c = (float)((ulong)*(undefined8 *)(pfVar1 + 0xe) >> 0x20);
    fVar6 = local_1c8 * fStack_110 + local_1f8 * fStack_170;
    fVar8 = fStack_1c4 * fStack_10c + fStack_1f4 * fStack_16c;
    fStack_200 = (float)*(undefined8 *)(local_390 + 6);
    local_198 = (float)*(undefined8 *)(pfVar1 + 0x10);
    fStack_194 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x10) >> 0x20);
    fStack_190 = (float)*(undefined8 *)(pfVar1 + 0x12);
    fStack_18c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x12) >> 0x20);
    fVar9 = (float)((ulong)*(undefined8 *)(local_390 + 6) >> 0x20);
    local_1b8 = (float)*(undefined8 *)(pfVar1 + 0x14);
    fStack_1b4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x14) >> 0x20);
    fStack_1b0 = (float)*(undefined8 *)(pfVar1 + 0x16);
    fStack_1ac = (float)((ulong)*(undefined8 *)(pfVar1 + 0x16) >> 0x20);
    fVar2 = fStack_1d0 * local_158 + fStack_200 * local_1b8;
    fVar4 = fVar7 * fStack_154 + fVar9 * fStack_1b4;
    fVar3 = local_1c8 * local_118 + local_1f8 * local_178 +
            fStack_1d0 * fStack_130 + fStack_200 * fStack_190 + fVar8 + fVar4;
    fVar5 = local_1c8 * fStack_114 + local_1f8 * fStack_174 +
            fStack_1d0 * fStack_12c + fStack_200 * fStack_18c +
            fStack_1c4 * local_138 + fStack_1f4 * local_198 +
            fVar7 * fStack_150 + fVar9 * fStack_1b0;
    fVar7 = fVar6 + fVar2 +
            fStack_1c4 * fStack_134 + fStack_1f4 * fStack_194 +
            fVar7 * fStack_14c + fVar9 * fStack_1ac;
    local_390 = local_390 + coefficient_width;
    local_388 = local_388 + 1;
    pfVar1 = local_3a8 + 3;
    if (output_buffer + output_sub_size * 3 <= pfVar1) {
      *(ulong *)local_3a8 = CONCAT44(fVar5,fVar3);
      local_3a8[2] = fVar7;
      return;
    }
    *(ulong *)local_3a8 = CONCAT44(fVar5,fVar3);
    *(ulong *)(local_3a8 + 2) = CONCAT44(fVar8 + fVar4 + fVar6 + fVar2,fVar7);
    local_3a8 = pfVar1;
  } while (pfVar1 < output_buffer + output_sub_size * 3);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_8_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__store_output();
  } while ( output < output_end );
}